

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_transaction.cpp
# Opt level: O2

void __thiscall duckdb::MetaTransaction::Rollback(MetaTransaction *this)

{
  AttachedDatabase *this_00;
  AttachedDatabase *in_RAX;
  reference pvVar1;
  TransactionManager *pTVar2;
  iterator iVar3;
  size_type __n;
  key_type local_38;
  
  __n = (long)(this->all_transactions).
              super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->all_transactions).
              super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_38._M_data = in_RAX;
  while (__n = __n - 1, __n != 0xffffffffffffffff) {
    pvVar1 = vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::get<true>
                       (&this->all_transactions,__n);
    this_00 = pvVar1->_M_data;
    pTVar2 = AttachedDatabase::GetTransactionManager(this_00);
    local_38._M_data = this_00;
    iVar3 = ::std::
            _Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,_std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->transactions)._M_h,&local_38);
    (*pTVar2->_vptr_TransactionManager[4])
              (pTVar2,*(undefined8 *)
                       ((long)iVar3.
                              super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_true>
                              ._M_cur + 0x10));
  }
  return;
}

Assistant:

void MetaTransaction::Rollback() {
	// rollback transactions in reverse order
	for (idx_t i = all_transactions.size(); i > 0; i--) {
		auto &db = all_transactions[i - 1].get();
		auto &transaction_manager = db.GetTransactionManager();
		auto entry = transactions.find(db);
		D_ASSERT(entry != transactions.end());
		auto &transaction = entry->second.get();
		transaction_manager.RollbackTransaction(transaction);
	}
}